

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMBaseInfo.h
# Opt level: O0

char * ARM_PROC_IFlagsToString(uint val)

{
  char *pcStack_10;
  uint val_local;
  
  if (val == 1) {
    pcStack_10 = "f";
  }
  else if (val == 2) {
    pcStack_10 = "i";
  }
  else if (val == 4) {
    pcStack_10 = "a";
  }
  else {
    pcStack_10 = anon_var_dwarf_8752e + 0x11;
  }
  return pcStack_10;
}

Assistant:

inline static char *ARM_PROC_IFlagsToString(unsigned val)
{
	switch (val) {
		case ARM_CPSFLAG_F: return "f";
		case ARM_CPSFLAG_I: return "i";
		case ARM_CPSFLAG_A: return "a";
		default: return "";
	}
}